

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O0

qlonglong __thiscall QVariant::toLongLong(QVariant *this,bool *ok)

{
  longlong lVar1;
  bool *in_RDI;
  Private *unaff_retaddr;
  
  lVar1 = qNumVariantToHelper<long_long>(unaff_retaddr,in_RDI);
  return lVar1;
}

Assistant:

qlonglong QVariant::toLongLong(bool *ok) const
{
    return qNumVariantToHelper<qlonglong>(d, ok);
}